

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::flush(void)

{
  bool bVar1;
  reference pCVar2;
  Callback *callback;
  iterator __end1;
  iterator __begin1;
  CallbackVec *__range1;
  lock_guard<std::recursive_mutex> local_10;
  lock_guard<std::recursive_mutex> lock;
  
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_10,(mutex_type *)s_mutex);
  fflush(_stderr);
  __end1 = std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::begin
                     ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  callback = (Callback *)
             std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::end
                       ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
                                *)&callback);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
             ::operator*(&__end1);
    if (pCVar2->flush != (flush_handler_t)0x0) {
      (*pCVar2->flush)(pCVar2->user_data);
    }
    __gnu_cxx::
    __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
    ::operator++(&__end1);
  }
  s_needs_flushing = 0;
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_10);
  return;
}

Assistant:

void flush()
	{
		std::lock_guard<std::recursive_mutex> lock(s_mutex);
		fflush(stderr);
		for (const auto& callback : s_callbacks)
		{
			if (callback.flush) {
				callback.flush(callback.user_data);
			}
		}
		s_needs_flushing = false;
	}